

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.c
# Opt level: O3

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  uint16_t uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  uint16_t uVar15;
  long lVar16;
  uint uVar17;
  
  if (buflen != 0) {
    u->field_set = 0;
    u->port = 0;
    if ((long)buflen < 1) {
      return (uint)(is_connect != 0);
    }
    iVar10 = (uint)(is_connect != 0) * 4 + 0x14;
    uVar17 = 7;
    lVar16 = 0;
    uVar13 = 0;
    bVar4 = false;
    do {
      bVar2 = buf[lVar16];
      uVar11 = (ulong)bVar2;
      if ((bVar2 < 0x21) && ((0x100003600U >> (uVar11 & 0x3f) & 1) != 0)) {
        return 1;
      }
      switch((long)&switchD_00108229::switchdataD_0010c4a4 +
             (long)(int)(&switchD_00108229::switchdataD_0010c4a4)[iVar10 - 0x14]) {
      case 0x10822b:
        if (uVar11 == 0x2f) goto LAB_001083b6;
        if (bVar2 != 0x3f) {
          if (bVar2 == 0x40) {
            uVar7 = 1;
            iVar10 = 0x1a;
            bVar4 = true;
          }
          else {
            uVar7 = 1;
            iVar10 = 0x19;
            if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) &&
                ((0x3e < bVar2 - 0x21 ||
                 ((0x5400000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) == 0)))) &&
               (bVar2 != 0x7e)) {
              return 1;
            }
          }
          goto LAB_0010843f;
        }
        iVar10 = 0x1c;
        break;
      case 0x108366:
        if ((uVar11 == 0x2a) || (bVar2 == 0x2f)) {
LAB_001083b6:
          uVar7 = 3;
          iVar10 = 0x1b;
        }
        else {
          if (0x19 < (byte)((bVar2 | 0x20) + 0x9f)) {
            return 1;
          }
          uVar7 = 0;
          iVar10 = 0x15;
        }
LAB_0010843f:
        if (uVar7 == uVar17) {
          puVar1 = &u->field_data[uVar17].len;
          *puVar1 = *puVar1 + 1;
        }
        else {
          u->field_data[uVar7].off = (uint16_t)lVar16;
          u->field_data[uVar7].len = 1;
          uVar13 = uVar13 | 1 << uVar7;
          u->field_set = (uint16_t)uVar13;
          uVar17 = uVar7;
        }
      }
      lVar5 = lVar16 + 1;
      lVar16 = lVar16 + 1;
    } while (buf + lVar5 < buf + buflen);
    if (((ushort)uVar13 & 3) != 1) {
      if ((uVar13 & 2) != 0) {
        iVar10 = (uint)!bVar4 * 2 + 2;
        uVar11 = (ulong)u->field_data[1].len;
        uVar14 = (ulong)u->field_data[1].off;
        u->field_data[1].len = 0;
        if (uVar11 != 0) {
          lVar16 = uVar11 + uVar14;
          uVar15 = 0;
          do {
            bVar2 = buf[uVar14];
            switch((long)&switchD_0010856f::switchdataD_0010c4fc +
                   (long)(int)(&switchD_0010856f::switchdataD_0010c4fc)[iVar10 - 2]) {
            case 0x108572:
              iVar6 = 4;
              if (bVar2 != 0x40) {
                if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) &&
                    ((0x3e < bVar2 - 0x21 ||
                     ((0x4000000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) == 0)))) &&
                   (bVar2 != 0x7e)) {
                  return 1;
                }
                if (iVar10 == 3) {
                  uVar9 = u->field_data[6].len + 1;
                }
                else {
                  u->field_data[6].off = (uint16_t)uVar14;
                  uVar13 = uVar13 | 0x40;
                  u->field_set = (uint16_t)uVar13;
                  uVar9 = 1;
                }
                u->field_data[6].len = uVar9;
                iVar6 = 3;
              }
              break;
            case 0x1085f2:
              iVar6 = 5;
              if (bVar2 != 0x5b) {
                if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                   (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30))) {
                  return 1;
                }
                u->field_data[1].off = (uint16_t)uVar14;
                uVar15 = uVar15 + 1;
                u->field_data[1].len = uVar15;
                iVar6 = 6;
              }
            }
            iVar10 = iVar6;
            lVar5 = uVar14 + 1;
            uVar14 = uVar14 + 1;
          } while (buf + lVar5 < buf + lVar16);
        }
        if ((iVar10 - 2U < 10) && ((0x3afU >> (iVar10 - 2U & 0x1f) & 1) != 0)) {
          return 1;
        }
      }
      if (is_connect == 0) {
        if ((uVar13 & 4) == 0) {
          return 0;
        }
      }
      else if ((short)uVar13 != 6) {
        return 1;
      }
      uVar11 = (ulong)u->field_data[2].off;
      uVar3 = u->field_data[2].len;
      if (uVar3 + uVar11 <= buflen) {
        if (uVar3 == 0) {
          uVar11 = 0;
        }
        else {
          pcVar12 = buf + uVar11;
          pcVar8 = pcVar12 + uVar3;
          uVar11 = 0;
          do {
            uVar11 = ((long)*pcVar12 + uVar11 * 10) - 0x30;
            if (0xffff < uVar11) {
              return 1;
            }
            pcVar12 = pcVar12 + 1;
          } while (pcVar12 < pcVar8);
        }
        u->port = (uint16_t)uVar11;
        return 0;
      }
      __assert_fail("off + len <= buflen && \"Port number overflow\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                    ,0x27c,
                    "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                   );
    }
  }
  return 1;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}